

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void ncoh_set(int n,double *x,double *w)

{
  ostream *poVar1;
  int iVar2;
  long lVar3;
  
  switch(n) {
  case 1:
    *w = 2.0;
    break;
  case 2:
    *w = 1.0;
    w[1] = 1.0;
    break;
  case 3:
    *w = 0.75;
    w[1] = 0.5;
    w[2] = 0.75;
    break;
  case 4:
    *w = 0.5416666666666666;
    w[1] = 0.4583333333333333;
    w[2] = 0.4583333333333333;
    w[3] = 0.5416666666666666;
    break;
  case 5:
    *w = 0.4774305555555556;
    w[1] = 0.1736111111111111;
    w[2] = 0.6979166666666666;
    w[3] = 0.1736111111111111;
    w[4] = 0.4774305555555556;
    break;
  case 6:
    *w = 0.3859375;
    w[1] = 0.2171875;
    w[2] = 0.396875;
    w[3] = 0.396875;
    w[4] = 0.2171875;
    w[5] = 0.3859375;
    break;
  case 7:
    *w = 0.3580005787037037;
    w[1] = 0.012760416666666666;
    w[2] = 0.8102864583333333;
    w[3] = -0.3620949074074074;
    w[4] = 0.8102864583333333;
    w[5] = 0.012760416666666666;
    w[6] = 0.3580005787037037;
    break;
  case 8:
    *w = 0.3055007853835979;
    w[1] = 0.07371135085978836;
    w[2] = 0.4875279017857143;
    w[3] = 0.13325996197089948;
    w[4] = 0.13325996197089948;
    w[5] = 0.4875279017857143;
    w[6] = 0.07371135085978836;
    w[7] = 0.3055007853835979;
    break;
  case 9:
    *w = 0.29025565011160714;
    w[1] = -0.09096261160714286;
    w[2] = 1.0125376674107143;
    w[3] = -1.1255775669642858;
    w[4] = 1.8274937220982144;
    w[5] = -1.1255775669642858;
    w[6] = 1.0125376674107143;
    w[7] = -0.09096261160714286;
    w[8] = 0.29025565011160714;
    break;
  case 10:
    *w = 0.25572788568190585;
    w[1] = -0.0265214977230765;
    w[2] = 0.6604044811645723;
    w[3] = -0.3376966473076499;
    w[4] = 0.4480857781842482;
    w[5] = 0.4480857781842482;
    w[6] = -0.3376966473076499;
    w[7] = 0.6604044811645723;
    w[8] = -0.0265214977230765;
    w[9] = 0.25572788568190585;
    break;
  case 0xb:
    *w = 0.24627136427819343;
    w[1] = -0.16702713398426017;
    w[2] = 1.2712972817933959;
    w[3] = -2.1900453360959546;
    w[4] = 3.9174891783699155;
    w[5] = -4.15597070872258;
    w[6] = 3.9174891783699155;
    w[7] = -2.1900453360959546;
    w[8] = 1.2712972817933959;
    w[9] = -0.16702713398426017;
    w[10] = 0.24627136427819343;
    break;
  case 0xc:
    *w = 0.22160321058132948;
    w[1] = -0.1031561669023522;
    w[2] = 0.8892549833487638;
    w[3] = -1.081607283555068;
    w[4] = 1.4918054608762006;
    w[5] = -0.41790020434887376;
    w[6] = -0.41790020434887376;
    w[7] = 1.4918054608762006;
    w[8] = -1.081607283555068;
    w[9] = 0.8892549833487638;
    w[10] = -0.1031561669023522;
    w[0xb] = 0.22160321058132948;
    break;
  case 0xd:
    *w = 0.21523235641915356;
    w[1] = -0.22715428927607015;
    w[2] = 1.5715464075695857;
    w[3] = -3.601889317405568;
    w[4] = 7.51615534838963;
    w[5] = -10.778534323876224;
    w[6] = 12.609287636358985;
    w[7] = -10.778534323876224;
    w[8] = 7.51615534838963;
    w[9] = -3.601889317405568;
    w[10] = 1.5715464075695857;
    w[0xb] = -0.22715428927607015;
    w[0xc] = 0.21523235641915356;
    break;
  case 0xe:
    *w = 0.19660073186294447;
    w[1] = -0.16517924236216847;
    w[2] = 1.1608579016274392;
    w[3] = -2.1458227123868414;
    w[4] = 3.665849234236847;
    w[5] = -3.340450511686524;
    w[6] = 1.6281445987083034;
    w[7] = 1.6281445987083034;
    w[8] = -3.340450511686524;
    w[9] = 3.665849234236847;
    w[10] = -2.1458227123868414;
    w[0xb] = 1.1608579016274392;
    w[0xc] = -0.16517924236216847;
    w[0xd] = 0.19660073186294447;
    break;
  case 0xf:
    *w = 0.19205365611225117;
    w[1] = -0.2770429412582505;
    w[2] = 1.9050943460089513;
    w[3] = -5.397016229890834;
    w[4] = 13.108528175354646;
    w[5] = -23.346694520643677;
    w[6] = 33.44784226820917;
    w[7] = -37.265529507784514;
    w[8] = 33.44784226820917;
    w[9] = -23.346694520643677;
    w[10] = 13.108528175354646;
    w[0xb] = -5.397016229890834;
    w[0xc] = 1.9050943460089513;
    w[0xd] = -0.2770429412582505;
    w[0xe] = 0.19205365611225117;
    break;
  case 0x10:
    *w = 0.17740847987958971;
    w[1] = -0.21735939977105617;
    w[2] = 1.4674096791459572;
    w[3] = -3.568209825961987;
    w[4] = 7.424296245974472;
    w[5] = -10.16143448029432;
    w[6] = 9.74825566269697;
    w[7] = -3.870366361669627;
    w[8] = -3.870366361669627;
    w[9] = 9.74825566269697;
    w[10] = -10.16143448029432;
    w[0xb] = 7.424296245974472;
    w[0xc] = -3.568209825961987;
    w[0xd] = 1.4674096791459572;
    w[0xe] = -0.21735939977105617;
    w[0xf] = 0.17740847987958971;
    break;
  case 0x11:
    *w = 0.17402172836320373;
    w[1] = -0.3198446367978636;
    w[2] = 2.266852534176209;
    w[3] = -7.605652460927443;
    w[4] = 21.22058633131962;
    w[5] = -44.932691405454605;
    w[6] = 76.65987406877242;
    w[7] = -104.62170471308602;
    w[8] = 116.31711710726896;
    w[9] = -104.62170471308602;
    w[10] = 76.65987406877242;
    w[0xb] = -44.932691405454605;
    w[0xc] = 21.22058633131962;
    w[0xd] = -7.605652460927443;
    w[0xe] = 2.266852534176209;
    w[0xf] = -0.3198446367978636;
    w[0x10] = 0.17402172836320373;
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"NCOH_SET - Fatal error!\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of N = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&std::cerr,"  Legal values are 1 to 17.\n");
    exit(1);
  }
  iVar2 = n * 2 + -1;
  for (lVar3 = 0; (ulong)(uint)n * 2 != lVar3; lVar3 = lVar3 + 2) {
    *(double *)((long)x + lVar3 * 4) = ((double)((int)lVar3 + 1) - (double)iVar2) / (double)(n * 2);
    iVar2 = iVar2 + -2;
  }
  return;
}

Assistant:

void ncoh_set ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    NCOH_SET sets abscissas and weights for Newton-Cotes "open half" rules.
//
//  Discussion:
//
//    The open Newton-Cotes rules use equally spaced abscissas, and
//    hence may be used with equally spaced data.
//
//    The rules are called "open" because the abscissas do not include
//    the interval endpoints.
//
//    For this uncommon type of open Newton-Cotes rule, the abscissas for
//    rule N are found by dividing the interval into N equal subintervals,
//    and using the midpoint of each subinterval as the abscissa.
//
//    Most of the rules involve negative weights.  These can produce loss
//    of accuracy due to the subtraction of large, nearly equal quantities.
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= N ) W(I) * F ( X(I) )
//
//    In Mathematica, the Newton-Cotes "open half" weights and abscissas
//    can be computed by the commands:
//
//      Needs["NumericalDifferentialEquationAnalysis`"]
//      NewtonCotesWeights [ n, -1, 1, QuadratureType -> Open ]
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    21 April 2010
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Stephen Wolfram,
//    The Mathematica Book,
//    Fourth Edition,
//    Wolfram Media / Cambridge University Press, 1999.
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996,
//    ISBN: 0-8493-2479-3.
//
//  Parameters:
//
//    Input, int N, the order.
//    1 <= N <= 17.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double a;
  double b;
  double d;
  int i;

  if ( n == 1 )
  {
    w[0] = 2.0E+00;
  }
  else if ( n == 2 )
  {
    w[0] = 1.0E+00;
    w[1] = 1.0E+00;
  }
  else if ( n == 3 )
  {
    d = 4.0E+00;

    w[0] =   3.0E+00 / d;
    w[1] =   2.0E+00 / d;
    w[2] =   3.0E+00 / d;
  }
  else if ( n == 4 )
  {
    d = 24.0E+00;

    w[0] = 13.0E+00 / d;
    w[1] = 11.0E+00 / d;
    w[2] = 11.0E+00 / d;
    w[3] = 13.0E+00 / d;
  }
  else if ( n == 5 )
  {
    d = 576.0E+00;

    w[0] =  275.0E+00 / d;
    w[1] =  100.0E+00 / d;
    w[2] =  402.0E+00 / d;
    w[3] =  100.0E+00 / d;
    w[4] =  275.0E+00 / d;
  }
  else if ( n == 6 )
  {
    d = 640.0E+00;

    w[0] =   247.0E+00 / d;
    w[1] =   139.0E+00 / d;
    w[2] =   254.0E+00 / d;
    w[3] =   254.0E+00 / d;
    w[4] =   139.0E+00 / d;
    w[5] =   247.0E+00 / d;
  }
  else if ( n == 7 )
  {
    d = 138240.0E+00;

    w[0] =   49490.0E+00 / d;
    w[1] =    1764.0E+00 / d;
    w[2] =  112014.0E+00 / d;
    w[3] =  -50056.0E+00 / d;
    w[4] =  112014.0E+00 / d;
    w[5] =    1764.0E+00 / d;
    w[6] =   49490.0E+00 / d;
  }
  else if ( n == 8 )
  {
    d = 967680.0E+00;

    w[0] =  295627.0E+00 / d;
    w[1] =   71329.0E+00 / d;
    w[2] =  471771.0E+00 / d;
    w[3] =  128953.0E+00 / d;
    w[4] =  128953.0E+00 / d;
    w[5] =  471771.0E+00 / d;
    w[6] =   71329.0E+00 / d;
    w[7] =  295627.0E+00 / d;
  }
  else if ( n == 9 )
  {
    d = 2867200.0E+00;

    w[0] =    832221.0E+00 / d;
    w[1] =   -260808.0E+00 / d;
    w[2] =   2903148.0E+00 / d;
    w[3] =  -3227256.0E+00 / d;
    w[4] =   5239790.0E+00 / d;
    w[5] =  -3227256.0E+00 / d;
    w[6] =   2903148.0E+00 / d;
    w[7] =   -260808.0E+00 / d;
    w[8] =    832221.0E+00 / d;
  }
  else if ( n == 10 )
  {
    d = 18579456.0E+00;

    w[0] =    4751285.0E+00 / d;
    w[1] =    -492755.0E+00 / d;
    w[2] =   12269956.0E+00 / d;
    w[3] =   -6274220.0E+00 / d;
    w[4] =    8325190.0E+00 / d;
    w[5] =    8325190.0E+00 / d;
    w[6] =   -6274220.0E+00 / d;
    w[7] =   12269956.0E+00 / d;
    w[8] =    -492755.0E+00 / d;
    w[9] =   4751285.0E+00 / d;
  }
  else if ( n == 11 )
  {
    w[ 0] = + 0.246271364278193434009406231628;
    w[ 1] = - 0.167027133984260177836566725456;
    w[ 2] = + 1.27129728179339588844797178131;
    w[ 3] = - 2.19004533609595458553791887125;
    w[ 4] = + 3.91748917836991567460317460317;
    w[ 5] = - 4.15597070872258046737213403880;
    w[ 6] = + 3.91748917836991567460317460317;
    w[ 7] = - 2.19004533609595458553791887125;
    w[ 8] = + 1.27129728179339588844797178131;
    w[9] = - 0.167027133984260177836566725456;
    w[10] = + 0.246271364278193434009406231628;
  }
  else if ( n == 12 )
  {
    w[ 0] = + 0.221603210581329477813852813853;
    w[ 1] = - 0.103156166902352205086580086580;
    w[ 2] = + 0.889254983348763866341991341991;
    w[ 3] = - 1.08160728355506797889610389610;
    w[ 4] = + 1.49180546087620062229437229437;
    w[ 5] = - 0.417900204348873782467532467532;
    w[ 6] = - 0.417900204348873782467532467532;
    w[ 7] = + 1.49180546087620062229437229437;
    w[ 8] = - 1.08160728355506797889610389610; 
    w[9] = + 0.889254983348763866341991341991;
    w[10] = - 0.103156166902352205086580086580;
    w[11] = + 0.221603210581329477813852813853;
  }
  else if ( n == 13 )
  {
    w[0] = 0.215232356419153566228270676022;
    w[1] = -0.227154289276070155983970468097;
    w[2] = 1.57154640756958579127322926926;
    w[3] = -3.60188931740556785445074962271;
    w[4] = 7.51615534838963020202557032914;
    w[5] = -10.7785343238762239297023523214;
    w[6] = 12.6092876363589847612200042756;
    w[7] = -10.7785343238762239297023523214;
    w[8] = 7.51615534838963020202557032914;
    w[9] = -3.60188931740556785445074962271;
    w[10] = 1.57154640756958579127322926926;
    w[11] = -0.227154289276070155983970468097;
    w[12] = 0.215232356419153566228270676022;
  }
  else if ( n == 14 )
  {
    w[0] = 0.196600731862944474955289480752;
    w[1] = -0.165179242362168469504443173425;
    w[2] = 1.16085790162743923526801130968;
    w[3] = -2.14582271238684154514413484321;
    w[4] = 3.66584923423684682693019643251;
    w[5] = -3.34045051168652382743365816282;
    w[6] = 1.62814459870830330492873895652;
    w[7] = 1.62814459870830330492873895652;
    w[8] = -3.34045051168652382743365816282;
    w[9] = 3.66584923423684682693019643251;
    w[10] = -2.14582271238684154514413484321;
    w[11] = 1.16085790162743923526801130968;
    w[12] = -0.165179242362168469504443173425;
    w[13] = 0.196600731862944474955289480752;
  }
  else if ( n == 15 )
  {
    w[0] = 0.192053656112251156523443074782;
    w[1] = -0.277042941258250537556131864168;
    w[2] = 1.90509434600895135399617123947;
    w[3] = -5.39701622989083452471078029114;
    w[4] = 13.1085281753546466152623727959;
    w[5] = -23.3466945206436771323681898459;
    w[6] = 33.4478422682091702199516443378;
    w[7] = -37.2655295077845143021970588935;
    w[8] = 33.4478422682091702199516443378;
    w[9] = -23.3466945206436771323681898459;
    w[10] = 13.1085281753546466152623727959;
    w[11] = -5.39701622989083452471078029114;
    w[12] = 1.90509434600895135399617123947;
    w[13] = -0.277042941258250537556131864168;
    w[14] = 0.192053656112251156523443074782;
  }
  else if ( n == 16 )
  {
    w[0] = 0.177408479879589716830780293564;
    w[1] = -0.217359399771056183974705378131;
    w[2] = 1.46740967914595726066296033468;
    w[3] = -3.56820982596198712548876407280;
    w[4] = 7.42429624597447227175662173974;
    w[5] = -10.1614344802943189309930887295;
    w[6] = 9.74825566269696996625640284529;
    w[7] = -3.87036636166962697505020703289;
    w[8] = -3.87036636166962697505020703289;
    w[9] = 9.74825566269696996625640284529;
    w[10] = -10.1614344802943189309930887295;
    w[11] = 7.42429624597447227175662173974;
    w[12] = -3.56820982596198712548876407280;
    w[13] = 1.46740967914595726066296033468;
    w[14] = -0.217359399771056183974705378131;
    w[15] = 0.177408479879589716830780293564;
  }
  else if ( n == 17 )
  {
    w[0] = 0.174021728363203743659784786159;
    w[1] = -0.319844636797863622878597303396;
    w[2] = 2.26685253417620917889510925819;
    w[3] = -7.60565246092744264614795072379;
    w[4] = 21.2205863313196208783745036601;
    w[5] = -44.9326914054546061828308816595;
    w[6] = 76.6598740687724224896458863733;
    w[7] = -104.621704713086021393464459433;
    w[8] = 116.317117107268955109493210084;
    w[9] = -104.621704713086021393464459433;
    w[10] = 76.6598740687724224896458863733;
    w[11] = -44.9326914054546061828308816595;
    w[12] = 21.2205863313196208783745036601;
    w[13] = -7.60565246092744264614795072379;
    w[14] = 2.26685253417620917889510925819;
    w[15] = -0.319844636797863622878597303396;
    w[16] = 0.174021728363203743659784786159;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "NCOH_SET - Fatal error!\n";
    std::cerr << "  Illegal value of N = " << n << "\n";
    std::cerr << "  Legal values are 1 to 17.\n";
    exit ( 1 );
  }
//
//  Set the abscissas.
//
  a = -1.0E+00;
  b = +1.0E+00;

  for ( i = 0; i < n; i++ )
  {
    x[i] = ( double( 2 * n - 2 * i - 1 ) * a   
           + double(         2 * i + 1 ) * b ) 
           / double( 2 * n                   );
  }

  return;
}